

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

int __thiscall
capnp::SchemaLoader::BrandedInitializerImpl::init(BrandedInitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  RawSchema *schema;
  bool bVar1;
  int extraout_EAX;
  Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *pOVar2;
  Impl *pIVar3;
  RawBrandedSchema ***pppRVar4;
  RawBrandedSchema *pRVar5;
  size_t sVar6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar7;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> local_e8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_d8;
  undefined1 local_c0 [8];
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> deps;
  Fault f;
  undefined1 local_a0 [8];
  DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&> _kjCondition;
  Fault local_70;
  Disposer *local_68;
  Impl *local_60;
  undefined1 local_48 [16];
  RawBrandedSchema **_kj_result;
  RawBrandedSchema *mutableSchema;
  undefined1 local_28 [8];
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  RawBrandedSchema *schema_local;
  BrandedInitializerImpl *this_local;
  
  lock.ptr = (Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *)ctx;
  _::RawSchema::ensureInitialized(*(RawSchema **)ctx);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_28,
             this->loader);
  if (lock.ptr[2].disposer == (Disposer *)0x0) {
    mutableSchema._0_4_ = 1;
  }
  else {
    pOVar2 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                       ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_28);
    pIVar3 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar2);
    local_68 = (lock.ptr)->disposer;
    local_60 = (lock.ptr)->ptr;
    kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::
    find<capnp::(anonymous_namespace)::SchemaBindingsPair>
              ((HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>
                *)local_48,(SchemaBindingsPair *)&pIVar3->brands);
    local_48._8_8_ =
         kj::_::readMaybe<capnp::_::RawBrandedSchema*>
                   ((Maybe<capnp::_::RawBrandedSchema_*&> *)local_48);
    if ((RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
         *)local_48._8_8_ ==
        (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
         *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x841,FAILED,
                 "lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }) != nullptr"
                 ,"");
      kj::_::Debug::Fault::fatal(&local_70);
    }
    pppRVar4 = kj::mv<capnp::_::RawBrandedSchema**>((RawBrandedSchema ***)(local_48 + 8));
    _kjCondition._32_8_ = *pppRVar4;
    _kj_result = *(RawBrandedSchema ***)_kjCondition._32_8_;
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (RawBrandedSchema **)&_kj_result);
    kj::_::DebugExpression<capnp::_::RawBrandedSchema*&>::operator==
              ((DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&>
                *)local_a0,(DebugExpression<capnp::_::RawBrandedSchema*&> *)&f,
               (RawBrandedSchema **)&lock.ptr);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawBrandedSchema*&,capnp::_::RawBrandedSchema_const*&>&>
                ((Fault *)&deps.size_,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x842,FAILED,"mutableSchema == schema","_kjCondition,",
                 (DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&>
                  *)local_a0);
      kj::_::Debug::Fault::fatal((Fault *)&deps.size_);
    }
    pOVar2 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                       ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_28);
    pIVar3 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar2);
    schema = (RawSchema *)*_kj_result;
    local_e8 = kj::arrayPtr<capnp::_::RawBrandedSchema::Scope_const>
                         ((Scope *)_kj_result[1],(ulong)*(uint *)(_kj_result + 3));
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe(&local_d8,&local_e8);
    AVar7 = Impl::makeBrandedDependencies(pIVar3,schema,&local_d8);
    deps.ptr = (Dependency *)AVar7.size_;
    local_c0 = (undefined1  [8])AVar7.ptr;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_d8);
    pRVar5 = (RawBrandedSchema *)
             kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::begin
                       ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_c0);
    _kj_result[2] = pRVar5;
    sVar6 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::size
                      ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_c0);
    *(int *)((long)_kj_result + 0x1c) = (int)sVar6;
    _kj_result[4] = (RawBrandedSchema *)0x0;
    mutableSchema._0_4_ = 0;
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_28);
  return extraout_EAX;
}

Assistant:

void SchemaLoader::BrandedInitializerImpl::init(const _::RawBrandedSchema* schema) const {
  schema->generic->ensureInitialized();

  auto lock = loader.impl.lockExclusive();

  if (schema->lazyInitializer == nullptr) {
    // Never mind, someone beat us to it.
    return;
  }

  // Get the mutable version.
  _::RawBrandedSchema* mutableSchema = KJ_ASSERT_NONNULL(
      lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }));
  KJ_ASSERT(mutableSchema == schema);

  // Construct its dependency map.
  auto deps = lock->get()->makeBrandedDependencies(mutableSchema->generic,
      kj::arrayPtr(mutableSchema->scopes, mutableSchema->scopeCount));
  mutableSchema->dependencies = deps.begin();
  mutableSchema->dependencyCount = deps.size();

  // It's initialized now, so disable the initializer.
#if __GNUC__ || defined(__clang__)
  __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
  std::atomic_thread_fence(std::memory_order_release);
  *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
      &mutableSchema->lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
}